

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.hpp
# Opt level: O3

void __thiscall SimpleConfiguration::insertSpin(SimpleConfiguration *this,bool spin,double tau)

{
  pointer *pppVar1;
  iterator __position;
  pair<bool,_double> local_18;
  
  __position._M_current =
       (this->c).
       super__Vector_base<std::pair<bool,_double>,_std::allocator<std::pair<bool,_double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->c).
      super__Vector_base<std::pair<bool,_double>,_std::allocator<std::pair<bool,_double>_>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage) {
    local_18.first = spin;
    local_18.second = tau;
    std::vector<std::pair<bool,double>,std::allocator<std::pair<bool,double>>>::
    _M_realloc_insert<std::pair<bool,double>>
              ((vector<std::pair<bool,double>,std::allocator<std::pair<bool,double>>> *)this,
               __position,&local_18);
  }
  else {
    *(ulong *)__position._M_current = CONCAT71(local_18._1_7_,spin);
    (__position._M_current)->second = tau;
    pppVar1 = &(this->c).
               super__Vector_base<std::pair<bool,_double>,_std::allocator<std::pair<bool,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + 1;
  }
  this->n = this->n + 1;
  return;
}

Assistant:

void insertSpin(bool spin, double tau) {
        c.push_back({spin, tau});
        ++n;
    }